

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_unix.cpp
# Opt level: O0

bool __thiscall QProcessPrivate::processStarted(QProcessPrivate *this,QString *errorMessage)

{
  QProcess *this_00;
  QSocketNotifier *this_01;
  long in_RSI;
  QProcessPrivate *in_RDI;
  long in_FS_OFFSET;
  ssize_t ret;
  QProcess *q;
  ChildError buf;
  QObject *in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffda4;
  undefined8 in_stack_fffffffffffffdb0;
  int fd;
  undefined1 enable;
  bool local_229;
  ssize_t in_stack_fffffffffffffde8;
  ChildError *in_stack_fffffffffffffdf0;
  undefined1 local_208 [512];
  long local_8;
  
  fd = (int)((ulong)in_stack_fffffffffffffdb0 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = q_func(in_RDI);
  memset(local_208,0xaa,0x200);
  this_01 = (QSocketNotifier *)
            qt_safe_read(fd,in_RDI,CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
  if (in_RDI->stateNotifier != (QSocketNotifier *)0x0) {
    QSocketNotifier::setEnabled((QSocketNotifier *)this_00,SUB81((ulong)this_01 >> 0x38,0));
    QObject::disconnect((QObject *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                        in_stack_fffffffffffffd98,(char *)0x7a1e9c);
  }
  qt_safe_close(in_stack_fffffffffffffda4);
  in_RDI->childStartedPipe[0] = -1;
  if ((long)this_01 < 1) {
    if (in_RDI->stateNotifier != (QSocketNotifier *)0x0) {
      QObject::connect((int)&stack0xfffffffffffffdf0,(sockaddr *)in_RDI->stateNotifier,0xa0deab);
      QMetaObject::Connection::~Connection
                ((Connection *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
      QSocketNotifier::setSocket(this_01,(qintptr)in_RDI);
      QSocketNotifier::setEnabled((QSocketNotifier *)this_00,SUB81((ulong)this_01 >> 0x38,0));
    }
    enable = (undefined1)((ulong)this_01 >> 0x38);
    if ((in_RDI->stdoutChannel).notifier != (QSocketNotifier *)0x0) {
      QSocketNotifier::setEnabled((QSocketNotifier *)this_00,(bool)enable);
    }
    if ((in_RDI->stderrChannel).notifier != (QSocketNotifier *)0x0) {
      QSocketNotifier::setEnabled((QSocketNotifier *)this_00,(bool)enable);
    }
    local_229 = true;
  }
  else {
    if (in_RSI != 0) {
      anon_unknown.dwarf_1185e52::startFailureErrorMessage
                (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
      QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                         (QString *)in_stack_fffffffffffffd98);
      QString::~QString((QString *)0x7a1fc0);
    }
    local_229 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_229;
  }
  __stack_chk_fail();
}

Assistant:

bool QProcessPrivate::processStarted(QString *errorMessage)
{
    Q_Q(QProcess);

    ChildError buf;
    ssize_t ret = qt_safe_read(childStartedPipe[0], &buf, sizeof(buf));

    if (stateNotifier) {
        stateNotifier->setEnabled(false);
        stateNotifier->disconnect(q);
    }
    qt_safe_close(childStartedPipe[0]);
    childStartedPipe[0] = -1;

#if defined (QPROCESS_DEBUG)
    qDebug("QProcessPrivate::processStarted() == %s", ret <= 0 ? "true" : "false");
#endif

    if (ret <= 0) {  // process successfully started
        if (stateNotifier) {
            QObject::connect(stateNotifier, SIGNAL(activated(QSocketDescriptor)),
                             q, SLOT(_q_processDied()));
            stateNotifier->setSocket(forkfd);
            stateNotifier->setEnabled(true);
        }
        if (stdoutChannel.notifier)
            stdoutChannel.notifier->setEnabled(true);
        if (stderrChannel.notifier)
            stderrChannel.notifier->setEnabled(true);

        return true;
    }

    // did we read an error message?
    if (errorMessage)
        *errorMessage = startFailureErrorMessage(buf, ret);

    return false;
}